

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

flag float64_le(float64 a,float64 b)

{
  flag fVar1;
  flag fVar2;
  int16 iVar3;
  bits64 bVar4;
  bool local_24;
  bool local_23;
  flag bSign;
  flag aSign;
  float64 b_local;
  float64 a_local;
  
  iVar3 = extractFloat64Exp(a);
  if (((iVar3 == 0x7ff) && (bVar4 = extractFloat64Frac(a), bVar4 != 0)) ||
     ((iVar3 = extractFloat64Exp(b), iVar3 == 0x7ff && (bVar4 = extractFloat64Frac(b), bVar4 != 0)))
     ) {
    float_raise('\x01');
    a_local._7_1_ = false;
  }
  else {
    fVar1 = extractFloat64Sign(a);
    fVar2 = extractFloat64Sign(b);
    if (fVar1 == fVar2) {
      local_24 = a == b || (int)fVar1 != (uint)(a < b);
      a_local._7_1_ = local_24;
    }
    else {
      local_23 = fVar1 != '\0' || ((a | b) & 0x7fffffffffffffff) == 0;
      a_local._7_1_ = local_23;
    }
  }
  return a_local._7_1_;
}

Assistant:

flag float64_le( float64 a, float64 b )
{
	flag aSign, bSign;

	if (    ( ( extractFloat64Exp( a ) == 0x7FF ) && extractFloat64Frac( a ) )
			|| ( ( extractFloat64Exp( b ) == 0x7FF ) && extractFloat64Frac( b ) )
		) {
		float_raise( float_flag_invalid );
		return 0;
	}
	aSign = extractFloat64Sign( a );
	bSign = extractFloat64Sign( b );
	if ( aSign != bSign ) return aSign || ( (bits64) ( ( a | b )<<1 ) == 0 );
	return ( a == b ) || ( aSign ^ ( a < b ) );

}